

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

Node * __thiscall
GEO::SmartPointer<GEO::FileSystem::Node>::operator->(SmartPointer<GEO::FileSystem::Node> *this)

{
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  SmartPointer<GEO::FileSystem::Node> *local_10;
  SmartPointer<GEO::FileSystem::Node> *this_local;
  
  if (this->pointer_ == (Node *)0x0) {
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"pointer_ != nullptr",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.h"
               ,&local_69);
    geo_assertion_failed((string *)local_30,(string *)local_68,0x482);
  }
  return this->pointer_;
}

Assistant:

T* operator-> () const {
            geo_assert(pointer_ != nullptr);
            return pointer_;
        }